

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildMaybeFunction(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  string *input;
  string local_48;
  Class *local_28;
  Class *clazz_local;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  local_28 = clazz;
  clazz_local = (Class *)value;
  value_local = (value *)this;
  bVar1 = picojson::value::is<std::__cxx11::string>(value);
  if (bVar1) {
    input = picojson::value::get<std::__cxx11::string>((value *)clazz_local);
    string_trim(&local_48,input);
    this_local._7_1_ = buildFunction(this,&local_48,local_28);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: function in class=\'");
    poVar2 = std::operator<<(poVar2,(string *)local_28);
    poVar2 = std::operator<<(poVar2,"\' is not a JSON string..");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ObjectModelBuilder::buildMaybeFunction(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: function in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildFunction(string_trim(value.get<std::string>()), clazz);
}